

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O1

int __thiscall basisu::huffman_encoding_table::init(huffman_encoding_table *this,EVP_PKEY_CTX *ctx)

{
  uint8_vec *this_00;
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  sym_freq *A;
  uint in_ECX;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  char *__function;
  int iVar9;
  int iVar10;
  long in_RDX;
  uint32_t j;
  uint32_t num_syms;
  size_type __n;
  undefined8 uVar11;
  uint uVar12;
  uint32_t new_size;
  ulong uVar13;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq0;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> sym_freq1;
  int num_codes [32];
  uint32_t next_code [32];
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> local_168;
  vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_> local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint auStack_b8 [34];
  
  uVar13 = (ulong)ctx & 0xffffffff;
  uVar6 = (uint)ctx;
  __n = 0;
  iVar9 = 0;
  if (0xffffbfff < uVar6 - 0x4001 && in_ECX < 0x11) {
    if (uVar6 != 0) {
      uVar4 = 0;
      __n = 0;
      do {
        __n = (size_type)(((int)__n + 1) - (uint)(*(short *)(in_RDX + uVar4 * 2) == 0));
        uVar4 = uVar4 + 1;
      } while (uVar13 != uVar4);
    }
    num_syms = (uint32_t)__n;
    if (num_syms == 0) {
      iVar9 = 0;
    }
    else {
      std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                (&local_168,__n,(allocator_type *)&local_138);
      std::vector<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>::vector
                (&local_150,__n,(allocator_type *)&local_138);
      if (uVar6 != 0) {
        uVar5 = 0;
        uVar4 = 0;
        do {
          uVar3 = *(ushort *)(in_RDX + uVar5 * 2);
          uVar7 = uVar4;
          if (uVar3 != 0) {
            local_168.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar4].m_key = (uint)uVar3;
            uVar7 = (ulong)((int)uVar4 + 1);
            local_168.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar4].m_sym_index = (uint16_t)uVar5;
          }
          uVar5 = uVar5 + 1;
          uVar4 = uVar7;
        } while (uVar13 != uVar5);
      }
      A = canonical_huffman_radix_sort_syms
                    (num_syms,local_168.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                     local_150.
                     super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl
                     .super__Vector_impl_data._M_start);
      canonical_huffman_calculate_minimum_redundancy(A,num_syms);
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      uVar4 = 0;
      do {
        if (0x1f < (ulong)A[uVar4].m_key) {
          iVar9 = 0;
          goto LAB_0022663d;
        }
        piVar1 = (int *)((long)&local_138 + (ulong)A[uVar4].m_key * 4);
        *piVar1 = *piVar1 + 1;
        uVar4 = uVar4 + 1;
      } while (num_syms + (num_syms == 0) != uVar4);
      canonical_huffman_enforce_max_code_size((int *)&local_138,num_syms,in_ECX);
      if ((this->m_code_sizes).m_size != 0) {
        (this->m_code_sizes).m_size = 0;
      }
      this_00 = &this->m_code_sizes;
      uVar12 = (this->m_code_sizes).m_size;
      if (uVar12 != uVar6) {
        if (uVar12 <= uVar6) {
          if ((this->m_code_sizes).m_capacity < uVar6) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this_00,uVar6,uVar12 + 1 == uVar6,1,(object_mover)0x0,
                       false);
          }
          uVar12 = (this->m_code_sizes).m_size;
          memset((this->m_code_sizes).m_p + uVar12,0,(ulong)(uVar6 - uVar12));
        }
        (this->m_code_sizes).m_size = uVar6;
      }
      if ((this->m_codes).m_size != 0) {
        (this->m_codes).m_size = 0;
      }
      uVar12 = (this->m_codes).m_size;
      if (uVar12 != uVar6) {
        if (uVar12 <= uVar6) {
          if ((this->m_codes).m_capacity < uVar6) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this,uVar6,uVar12 + 1 == uVar6,2,(object_mover)0x0,false)
            ;
          }
          uVar12 = (this->m_codes).m_size;
          memset((this->m_codes).m_p + uVar12,0,(ulong)(uVar6 - uVar12) * 2);
        }
        (this->m_codes).m_size = uVar6;
      }
      if (in_ECX != 0) {
        uVar4 = 1;
        do {
          for (iVar9 = *(int *)((long)&local_138 + uVar4 * 4); iVar9 != 0; iVar9 = iVar9 + -1) {
            __n = (size_type)((int)__n - 1);
            if ((this->m_code_sizes).m_size <= (uint)A[__n].m_sym_index) goto LAB_00226682;
            this_00->m_p[A[__n].m_sym_index] = (uchar)uVar4;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != in_ECX + 1);
      }
      auStack_b8[1] = 0;
      if (1 < in_ECX) {
        lVar8 = 0;
        uVar12 = 0;
        do {
          uVar12 = (uVar12 + *(int *)((long)&local_138 + lVar8 * 4 + 4)) * 2;
          auStack_b8[lVar8 + 2] = uVar12;
          lVar8 = lVar8 + 1;
        } while ((ulong)in_ECX - 1 != lVar8);
      }
      uVar11 = CONCAT71((int7)(__n >> 8),uVar6 == 0);
      iVar9 = (int)uVar11;
      if (uVar6 != 0) {
        uVar4 = 0;
        do {
          iVar9 = (int)uVar11;
          if ((this->m_code_sizes).m_size <= uVar4) {
LAB_00226682:
            __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
LAB_00226697:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,__function);
          }
          bVar2 = this_00->m_p[uVar4];
          uVar6 = (uint)bVar2;
          if (bVar2 == 0) {
            iVar10 = 0x16;
          }
          else {
            iVar10 = 1;
            if (bVar2 < 0x20) {
              uVar12 = auStack_b8[bVar2];
              auStack_b8[bVar2] = uVar12 + 1;
              iVar10 = 0;
              do {
                iVar10 = (uVar12 & 1) + iVar10 * 2;
                uVar12 = uVar12 >> 1;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
              if ((this->m_codes).m_size <= uVar4) {
                __function = 
                "T &basisu::vector<unsigned short>::operator[](size_t) [T = unsigned short]";
                goto LAB_00226697;
              }
              (this->m_codes).m_p[uVar4] = (unsigned_short)iVar10;
              iVar10 = 0;
            }
          }
          if ((iVar10 != 0x16) && (iVar10 != 0)) break;
          uVar4 = uVar4 + 1;
          uVar11 = CONCAT71((int7)((ulong)uVar11 >> 8),uVar13 <= uVar4);
          iVar9 = (int)uVar11;
        } while (uVar4 != uVar13);
      }
LAB_0022663d:
      if (local_150.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start != (sym_freq *)0x0) {
        operator_delete(local_150.
                        super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_168.super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>._M_impl.
          super__Vector_impl_data._M_start != (sym_freq *)0x0) {
        operator_delete(local_168.
                        super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<basisu::sym_freq,_std::allocator<basisu::sym_freq>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return iVar9;
}

Assistant:

bool huffman_encoding_table::init(uint32_t num_syms, const uint16_t *pFreq, uint32_t max_code_size)
	{
		if (max_code_size > cHuffmanMaxSupportedCodeSize)
			return false;
		if ((!num_syms) || (num_syms > cHuffmanMaxSyms))
			return false;

		uint32_t total_used_syms = 0;
		for (uint32_t i = 0; i < num_syms; i++)
			if (pFreq[i])
				total_used_syms++;

		if (!total_used_syms)
			return false;

		std::vector<sym_freq> sym_freq0(total_used_syms), sym_freq1(total_used_syms);
		for (uint32_t i = 0, j = 0; i < num_syms; i++)
		{
			if (pFreq[i])
			{
				sym_freq0[j].m_key = pFreq[i];
				sym_freq0[j++].m_sym_index = static_cast<uint16_t>(i);
			}
		}

		sym_freq *pSym_freq = canonical_huffman_radix_sort_syms(total_used_syms, &sym_freq0[0], &sym_freq1[0]);

		canonical_huffman_calculate_minimum_redundancy(pSym_freq, total_used_syms);

		int num_codes[cHuffmanMaxSupportedInternalCodeSize + 1];
		clear_obj(num_codes);

		for (uint32_t i = 0; i < total_used_syms; i++)
		{
			if (pSym_freq[i].m_key > cHuffmanMaxSupportedInternalCodeSize)
				return false;

			num_codes[pSym_freq[i].m_key]++;
		}

		canonical_huffman_enforce_max_code_size(num_codes, total_used_syms, max_code_size);

		m_code_sizes.resize(0);
		m_code_sizes.resize(num_syms);

		m_codes.resize(0);
		m_codes.resize(num_syms);

		for (uint32_t i = 1, j = total_used_syms; i <= max_code_size; i++)
			for (uint32_t l = num_codes[i]; l > 0; l--)
				m_code_sizes[pSym_freq[--j].m_sym_index] = static_cast<uint8_t>(i);

		uint32_t next_code[cHuffmanMaxSupportedInternalCodeSize + 1];

		next_code[1] = 0;
		for (uint32_t j = 0, i = 2; i <= max_code_size; i++)
			next_code[i] = j = ((j + num_codes[i - 1]) << 1);

		for (uint32_t i = 0; i < num_syms; i++)
		{
			uint32_t rev_code = 0, code, code_size;
			if ((code_size = m_code_sizes[i]) == 0)
				continue;
			if (code_size > cHuffmanMaxSupportedInternalCodeSize)
				return false;
			code = next_code[code_size]++;
			for (uint32_t l = code_size; l > 0; l--, code >>= 1)
				rev_code = (rev_code << 1) | (code & 1);
			m_codes[i] = static_cast<uint16_t>(rev_code);
		}

		return true;
	}